

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctsa.c
# Opt level: O1

void ar_predict(ar_object obj,double *inp,int L,double *xpred,double *amse)

{
  double dVar1;
  int N;
  uint ip;
  double *pdVar2;
  undefined8 *__ptr;
  double *W;
  double *resid;
  double *phi;
  double *theta;
  long lVar3;
  ulong uVar4;
  long lVar5;
  
  N = obj->N;
  lVar5 = (long)N;
  ip = obj->p;
  __ptr = (undefined8 *)malloc(8);
  W = (double *)malloc(lVar5 * 8);
  resid = (double *)malloc(lVar5 * 8);
  uVar4 = 1;
  if (1 < (int)ip) {
    uVar4 = (ulong)ip;
  }
  phi = (double *)malloc(uVar4 << 3);
  theta = (double *)malloc(uVar4 << 3);
  *__ptr = 0x3ff0000000000000;
  dVar1 = obj->mean;
  if (0 < lVar5) {
    pdVar2 = obj->res;
    lVar3 = 0;
    do {
      W[lVar3] = inp[lVar3] - dVar1;
      resid[lVar3] = pdVar2[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar5 != lVar3);
  }
  uVar4 = 1;
  if (1 < (int)ip) {
    uVar4 = (ulong)ip;
  }
  memset(theta,0,uVar4 << 3);
  memset(phi,0,uVar4 << 3);
  if (0 < (int)ip) {
    pdVar2 = obj->phi;
    uVar4 = 0;
    do {
      phi[uVar4] = pdVar2[uVar4];
      uVar4 = uVar4 + 1;
    } while (ip != uVar4);
  }
  forkal(ip,0,0,phi,theta,(double *)(__ptr + 1),N,W,resid,L,xpred,amse);
  if (0 < L) {
    uVar4 = 0;
    do {
      xpred[uVar4] = xpred[uVar4] + dVar1;
      uVar4 = uVar4 + 1;
    } while ((uint)L != uVar4);
  }
  free(__ptr);
  free(W);
  free(resid);
  free(phi);
  free(theta);
  return;
}

Assistant:

void ar_predict(ar_object obj, double *inp, int L, double *xpred, double *amse) {
	int d, i, N, ip, iq, ir;
	double *delta, *W, *resid, *phi, *theta;
	double wmean;

	d = 0;
	N = obj->N;
	ip = obj->p;
	iq = 0;
	delta = (double*)malloc(sizeof(double)* (d + 1));
	W = (double*)malloc(sizeof(double)* N);
	resid = (double*)malloc(sizeof(double)* N);

	ir = iq + 1;

	if (ir < ip) {
		ir = ip;
	}

	phi = (double*)malloc(sizeof(double)* ir);
	theta = (double*)malloc(sizeof(double)* ir);
	wmean = 0.0;
	if (d > 0) {
		deld(d, delta);
	}
	else {
		*delta = 1.0;
		wmean = obj->mean;
	}
	for (i = 1; i <= d; ++i) {
		delta[i] = -1.0 * delta[i];
	}
	for (i = 0; i < N; ++i) {
		W[i] = inp[i];
		if (d == 0) {
			W[i] -= wmean;
		}
		resid[i] = obj->res[i];
	}
	for (i = 0; i < ir; ++i) {
		phi[i] = theta[i] = 0.0;
	}

	for (i = 0; i < ip; ++i) {
		phi[i] = obj->phi[i];
	}

	for (i = 0; i < iq; ++i) {
		theta[i] = -1.0 *  0.0;
	}

	forkal(ip, iq, d, phi, theta, delta + 1, N, W, resid, L, xpred, amse);

	for (i = 0; i < L; ++i) {
		xpred[i] += wmean;
	}

	free(delta);
	free(W);
	free(resid);
	free(phi);
	free(theta);
}